

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void common_kv_cache_dump_view_seqs(llama_kv_cache_view *view,int row_size)

{
  size_type sVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  int j;
  long lVar4;
  int iVar5;
  llama_seq_id *plVar6;
  int j_1;
  uint uVar7;
  __node_base *p_Var8;
  llama_seq_id *__k;
  llama_seq_id *local_80;
  unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  seqs;
  
  printf("=== Dumping KV cache. total cells %d, max sequences per cell %d, populated cells %d, total tokens in cache %d, largest empty slot=%d @ %d\n"
         ,(ulong)(uint)view->n_cells,(ulong)(uint)view->n_seq_max,(ulong)(uint)view->used_cells,
         (ulong)(uint)view->token_count,(ulong)(uint)view->max_contiguous,view->max_contiguous_idx);
  seqs._M_h._M_buckets = &seqs._M_h._M_single_bucket;
  seqs._M_h._M_bucket_count = 1;
  p_Var8 = &seqs._M_h._M_before_begin;
  seqs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seqs._M_h._M_element_count = 0;
  seqs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  seqs._M_h._M_rehash_policy._M_next_resize = 0;
  seqs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_80 = view->cells_sequences;
  for (iVar5 = 0; iVar5 < view->n_cells; iVar5 = iVar5 + 1) {
    plVar6 = local_80;
    for (lVar4 = 0; lVar4 < view->n_seq_max; lVar4 = lVar4 + 1) {
      if (-1 < *plVar6) {
        iVar2 = std::
                _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&seqs._M_h,plVar6);
        sVar1 = seqs._M_h._M_element_count;
        if (iVar2.super__Node_iterator_base<std::pair<const_int,_unsigned_long>,_false>._M_cur ==
            (__node_type *)0x0) {
          if (seqs._M_h._M_element_count - 0x3e < 0xffffffffffffffc1) goto LAB_001c6983;
          pmVar3 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&seqs._M_h,plVar6);
          *pmVar3 = sVar1;
        }
      }
      plVar6 = plVar6 + 1;
    }
    if (seqs._M_h._M_element_count - 0x3e < 0xffffffffffffffc1) break;
    local_80 = local_80 + view->n_seq_max;
  }
LAB_001c6983:
  printf("=== Sequence legend: ");
  while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
    printf("%zu=%d, ",
           *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var8 + 2))->_M_max_load_factor,
           (ulong)(uint)*(size_type *)(p_Var8 + 1));
  }
  printf("\'+\'=other sequence ids");
  plVar6 = view->cells_sequences;
  for (uVar7 = 0; (int)uVar7 < view->n_cells; uVar7 = uVar7 + 1) {
    if ((int)uVar7 % row_size == 0) {
      printf("\n%5d: ",(ulong)uVar7);
    }
    __k = plVar6;
    for (lVar4 = 0; lVar4 < view->n_seq_max; lVar4 = lVar4 + 1) {
      iVar5 = 0x2e;
      if (-1 < *__k) {
        iVar2 = std::
                _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&seqs._M_h,__k);
        iVar5 = 0x2b;
        if (iVar2.super__Node_iterator_base<std::pair<const_int,_unsigned_long>,_false>._M_cur !=
            (__node_type *)0x0) {
          iVar5 = (int)"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
                       [*(long *)((long)iVar2.
                                        super__Node_iterator_base<std::pair<const_int,_unsigned_long>,_false>
                                        ._M_cur + 0x10)];
        }
      }
      putchar(iVar5);
      __k = __k + 1;
    }
    putchar(0x20);
    plVar6 = plVar6 + view->n_seq_max;
  }
  puts("\n=== Done dumping");
  std::
  _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&seqs._M_h);
  return;
}

Assistant:

void common_kv_cache_dump_view_seqs(const llama_kv_cache_view & view, int row_size) {
    static const char slot_chars[] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";

    printf("=== Dumping KV cache. total cells %d, max sequences per cell %d, populated cells %d, total tokens in cache %d, largest empty slot=%d @ %d\n",
        view.n_cells, view.n_seq_max, view.used_cells, view.token_count, view.max_contiguous, view.max_contiguous_idx);

    std::unordered_map<llama_seq_id, size_t> seqs;
    llama_kv_cache_view_cell * c_curr = view.cells;
    llama_seq_id * cs_curr = view.cells_sequences;

    for (int i = 0; i < view.n_cells; i++, c_curr++, cs_curr += view.n_seq_max) {
        for (int j = 0; j < view.n_seq_max; j++) {
            if (cs_curr[j] < 0) { continue; }
            if (seqs.find(cs_curr[j]) == seqs.end()) {
                if (seqs.size() + 1 >= sizeof(slot_chars)) { break; }
                const size_t sz = seqs.size();
                seqs[cs_curr[j]] = sz;
            }
        }
        if (seqs.size() + 1 >= sizeof(slot_chars)) { break; }
    }

    printf("=== Sequence legend: ");
    for (const auto & it : seqs) {
        printf("%zu=%d, ", it.second, it.first);
    }
    printf("'+'=other sequence ids");

    c_curr = view.cells;
    cs_curr = view.cells_sequences;
    for (int i = 0; i < view.n_cells; i++, c_curr++, cs_curr += view.n_seq_max) {
        if (i % row_size == 0) {
            printf("\n%5d: ", i);
        }
        for (int j = 0; j < view.n_seq_max; j++) {
            if (cs_curr[j] >= 0) {
                const auto & it = seqs.find(cs_curr[j]);
                putchar(it != seqs.end() ? int(slot_chars[it->second]) : '+');
            } else {
                putchar('.');
            }
        }
        putchar(' ');
    }

    printf("\n=== Done dumping\n");
}